

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

double vkt::shaderexecutor::anon_unknown_0::ldexp(double __x,int __exponent)

{
  int iVar1;
  StorageType mantissa;
  Float<unsigned_int,_8,_23,_127,_3U> FVar2;
  undefined4 unaff_EBP;
  uint uVar3;
  double dVar4;
  undefined8 in_XMM0_Qb;
  undefined1 auVar5 [16];
  Float32 mant;
  Float<unsigned_int,_8,_23,_127,_3U> local_1c;
  
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = __x;
  local_1c.m_value = SUB84(__x,0);
  if (((__exponent != 0) || ((float)local_1c.m_value != 0.0)) || (NAN((float)local_1c.m_value))) {
    uVar3 = movmskps(unaff_EBP,auVar5);
    iVar1 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_1c);
    mantissa = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa(&local_1c);
    FVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                      (-(uVar3 & 1) | 1,__exponent + iVar1,mantissa);
    dVar4 = (double)(ulong)FVar2.m_value;
  }
  else {
    dVar4 = (double)((ulong)__x & 0x8000000080000000);
  }
  return dVar4;
}

Assistant:

static inline float ldexp (float significand, int exponent)
{
	const tcu::Float32 mant(significand);

	if (exponent == 0 && mant.isZero())
	{
		return mant.sign() < 0 ? -0.0f : 0.0f;
	}
	else
	{
		return tcu::Float32::construct(mant.sign(), exponent+mant.exponent(), mant.mantissa()).asFloat();
	}
}